

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O2

uint __thiscall llvm::AArch64::getDefaultFPU(AArch64 *this,StringRef CPU,ArchKind AK)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  AlignedCharArray<4UL,_4UL> AVar4;
  char *pcVar5;
  bool bVar6;
  Optional<unsigned_int> local_38;
  
  pcVar5 = CPU.Data;
  if (pcVar5 == (char *)0x7) {
    iVar2 = bcmp(this,"generic",7);
    if (iVar2 == 0) {
      return *(uint *)(&DAT_001cae00 + (ulong)(uint)CPU.Length * 0x40);
    }
  }
  local_38.Storage.hasVal = false;
  AVar4.buffer[0] = '\x14';
  AVar4.buffer[1] = '\0';
  AVar4.buffer[2] = '\0';
  AVar4.buffer[3] = '\0';
  if (pcVar5 == (char *)0xa) {
    iVar2 = bcmp(this,"cortex-a35",10);
    if (iVar2 == 0) {
      local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
           (AlignedCharArray<4UL,_4UL>)(char  [4])0x14;
      local_38.Storage.hasVal = true;
      bVar1 = true;
      goto LAB_0016ef33;
    }
    iVar2 = bcmp(this,"cortex-a53",10);
    bVar6 = false;
    bVar1 = false;
    if (iVar2 != 0) goto LAB_0016ef3b;
LAB_0016f01e:
    local_38.Storage.hasVal = true;
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x14;
    bVar1 = true;
LAB_0016f029:
    bVar6 = pcVar5 == (char *)0x9;
    if ((((bVar6 && !bVar1) && (iVar2 = bcmp(this,"exynos-m2",9), iVar2 == 0)) ||
        ((bVar6 && !bVar1 && (iVar2 = bcmp(this,"exynos-m3",9), iVar2 == 0)))) ||
       ((((bVar6 && !bVar1 && (iVar2 = bcmp(this,"exynos-m4",9), iVar2 == 0)) ||
         ((pcVar5 == (char *)0x6 && !bVar1 && (iVar2 = bcmp(this,"falkor",6), iVar2 == 0)))) ||
        ((pcVar5 == (char *)0x7 && !bVar1 && (iVar2 = bcmp(this,"saphira",7), iVar2 == 0))))))
    goto LAB_0016f125;
    if (pcVar5 == (char *)0x4 && !bVar1) {
      if (*(int *)this == 0x6f79726b) goto LAB_0016f125;
      goto LAB_0016f135;
    }
    if (pcVar5 == (char *)0xc && !bVar1) {
      iVar2 = bcmp(this,"thunderx2t99",0xc);
      bVar6 = true;
      if (iVar2 == 0) {
LAB_0016f21e:
        bVar6 = true;
        local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
             (AlignedCharArray<4UL,_4UL>)(char  [4])0x14;
        local_38.Storage.hasVal = true;
        bVar1 = true;
      }
      goto LAB_0016f13d;
    }
    if (pcVar5 == (char *)0x8 && !bVar1) {
      bVar6 = true;
      if (*(long *)this == 0x787265646e756874) goto LAB_0016f21e;
      goto LAB_0016f13d;
    }
    bVar6 = pcVar5 != (char *)0xb;
    if ((bVar6 || bVar1) || (iVar2 = bcmp(this,"thunderxt88",0xb), iVar2 != 0)) goto LAB_0016f13d;
  }
  else {
    bVar1 = false;
LAB_0016ef33:
    bVar6 = pcVar5 != (char *)0xa;
LAB_0016ef3b:
    if (((((!bVar6 && !bVar1) && (iVar2 = bcmp(this,"cortex-a55",10), iVar2 == 0)) ||
         ((!bVar6 && !bVar1 && (iVar2 = bcmp(this,"cortex-a57",10), iVar2 == 0)))) ||
        (((!bVar6 && !bVar1 && (iVar2 = bcmp(this,"cortex-a72",10), iVar2 == 0)) ||
         ((!bVar6 && !bVar1 && (iVar2 = bcmp(this,"cortex-a73",10), iVar2 == 0)))))) ||
       ((!bVar6 && !bVar1 && (iVar2 = bcmp(this,"cortex-a75",10), iVar2 == 0)))) goto LAB_0016f01e;
    if (pcVar5 == (char *)0x7 && !bVar1) {
      iVar2 = bcmp(this,"cyclone",7);
      if (iVar2 == 0) goto LAB_0016f01e;
      goto LAB_0016f029;
    }
    if ((pcVar5 != (char *)0x9 || bVar1) || (iVar2 = bcmp(this,"exynos-m1",9), iVar2 != 0))
    goto LAB_0016f029;
LAB_0016f125:
    local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
         (AlignedCharArray<4UL,_4UL>)(char  [4])0x14;
    local_38.Storage.hasVal = true;
    bVar1 = true;
LAB_0016f135:
    bVar6 = pcVar5 != (char *)0xb;
LAB_0016f13d:
    if (((bVar6 || bVar1) || (iVar2 = bcmp(this,"thunderxt81",0xb), iVar2 != 0)) &&
       ((bVar6 || bVar1 || (iVar2 = bcmp(this,"thunderxt83",0xb), iVar2 != 0)))) {
      if ((pcVar5 != (char *)0x7 || bVar1) || (iVar2 = bcmp(this,"invalid",7), iVar2 != 0)) {
        if (!bVar1) {
          return 0;
        }
        goto LAB_0016f1ce;
      }
      AVar4.buffer[0] = '\0';
      AVar4.buffer[1] = '\0';
      AVar4.buffer[2] = '\0';
      AVar4.buffer[3] = '\0';
    }
  }
  local_38.Storage.hasVal = true;
  local_38.Storage.storage.super_AlignedCharArray<4UL,_4UL>.buffer =
       (AlignedCharArray<4UL,_4UL>)(AlignedCharArray<4UL,_4UL>)AVar4.buffer;
LAB_0016f1ce:
  puVar3 = Optional<unsigned_int>::getPointer(&local_38);
  return *puVar3;
}

Assistant:

unsigned llvm::AArch64::getDefaultFPU(StringRef CPU, ArchKind AK) {
  if (CPU == "generic")
    return AArch64ARCHNames[static_cast<unsigned>(AK)].DefaultFPU;

  return StringSwitch<unsigned>(CPU)
#define AARCH64_CPU_NAME(NAME, ID, DEFAULT_FPU, IS_DEFAULT, DEFAULT_EXT) \
    .Case(NAME, DEFAULT_FPU)
#include "llvm/Support/AArch64TargetParser.def"
    .Default(ARM::FK_INVALID);
}